

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssdp_server.c
# Opt level: O2

int AdvertiseAndReply(int AdFlag,UpnpDevice_Handle Hnd,SsdpSearchType SearchType,sockaddr *DestAddr,
                     char *DeviceType,char *DeviceUDN,char *ServiceType,int Exp)

{
  int Duration;
  int SleepPeriod;
  Upnp_Handle_Type UVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  char *FmtStr;
  int ByType;
  Handle_Info *SInfo;
  sockaddr *local_1d0;
  char *local_1c8;
  SsdpSearchType local_1c0;
  int local_1bc;
  long local_1b8;
  char *local_1b0;
  int local_1a8;
  int local_1a4;
  long local_1a0;
  char UDNstr [100];
  char cStack_129;
  char devType [100];
  char cStack_b9;
  char servType [100];
  timespec req;
  
  SInfo = (Handle_Info *)0x0;
  UDNstr[0] = '\0';
  UDNstr[1] = '\0';
  UDNstr[2] = '\0';
  UDNstr[3] = '\0';
  UDNstr[4] = '\0';
  UDNstr[5] = '\0';
  UDNstr[6] = '\0';
  UDNstr[7] = '\0';
  UDNstr[8] = '\0';
  UDNstr[9] = '\0';
  UDNstr[10] = '\0';
  UDNstr[0xb] = '\0';
  UDNstr[0xc] = '\0';
  UDNstr[0xd] = '\0';
  UDNstr[0xe] = '\0';
  UDNstr[0xf] = '\0';
  UDNstr[0x10] = '\0';
  UDNstr[0x11] = '\0';
  UDNstr[0x12] = '\0';
  UDNstr[0x13] = '\0';
  UDNstr[0x14] = '\0';
  UDNstr[0x15] = '\0';
  UDNstr[0x16] = '\0';
  UDNstr[0x17] = '\0';
  UDNstr[0x18] = '\0';
  UDNstr[0x19] = '\0';
  UDNstr[0x1a] = '\0';
  UDNstr[0x1b] = '\0';
  UDNstr[0x1c] = '\0';
  UDNstr[0x1d] = '\0';
  UDNstr[0x1e] = '\0';
  UDNstr[0x1f] = '\0';
  UDNstr[0x20] = '\0';
  UDNstr[0x21] = '\0';
  UDNstr[0x22] = '\0';
  UDNstr[0x23] = '\0';
  UDNstr[0x24] = '\0';
  UDNstr[0x25] = '\0';
  UDNstr[0x26] = '\0';
  UDNstr[0x27] = '\0';
  UDNstr[0x28] = '\0';
  UDNstr[0x29] = '\0';
  UDNstr[0x2a] = '\0';
  UDNstr[0x2b] = '\0';
  UDNstr[0x2c] = '\0';
  UDNstr[0x2d] = '\0';
  UDNstr[0x2e] = '\0';
  UDNstr[0x2f] = '\0';
  UDNstr[0x30] = '\0';
  UDNstr[0x31] = '\0';
  UDNstr[0x32] = '\0';
  UDNstr[0x33] = '\0';
  UDNstr[0x34] = '\0';
  UDNstr[0x35] = '\0';
  UDNstr[0x36] = '\0';
  UDNstr[0x37] = '\0';
  UDNstr[0x38] = '\0';
  UDNstr[0x39] = '\0';
  UDNstr[0x3a] = '\0';
  UDNstr[0x3b] = '\0';
  UDNstr[0x3c] = '\0';
  UDNstr[0x3d] = '\0';
  UDNstr[0x3e] = '\0';
  UDNstr[0x3f] = '\0';
  UDNstr[0x60] = '\0';
  UDNstr[0x61] = '\0';
  UDNstr[0x62] = '\0';
  UDNstr[99] = '\0';
  UDNstr[0x40] = '\0';
  UDNstr[0x41] = '\0';
  UDNstr[0x42] = '\0';
  UDNstr[0x43] = '\0';
  UDNstr[0x44] = '\0';
  UDNstr[0x45] = '\0';
  UDNstr[0x46] = '\0';
  UDNstr[0x47] = '\0';
  UDNstr[0x48] = '\0';
  UDNstr[0x49] = '\0';
  UDNstr[0x4a] = '\0';
  UDNstr[0x4b] = '\0';
  UDNstr[0x4c] = '\0';
  UDNstr[0x4d] = '\0';
  UDNstr[0x4e] = '\0';
  UDNstr[0x4f] = '\0';
  UDNstr[0x50] = '\0';
  UDNstr[0x51] = '\0';
  UDNstr[0x52] = '\0';
  UDNstr[0x53] = '\0';
  UDNstr[0x54] = '\0';
  UDNstr[0x55] = '\0';
  UDNstr[0x56] = '\0';
  UDNstr[0x57] = '\0';
  UDNstr[0x58] = '\0';
  UDNstr[0x59] = '\0';
  UDNstr[0x5a] = '\0';
  UDNstr[0x5b] = '\0';
  UDNstr[0x5c] = '\0';
  UDNstr[0x5d] = '\0';
  UDNstr[0x5e] = '\0';
  UDNstr[0x5f] = '\0';
  devType[0] = '\0';
  devType[1] = '\0';
  devType[2] = '\0';
  devType[3] = '\0';
  devType[4] = '\0';
  devType[5] = '\0';
  devType[6] = '\0';
  devType[7] = '\0';
  devType[8] = '\0';
  devType[9] = '\0';
  devType[10] = '\0';
  devType[0xb] = '\0';
  devType[0xc] = '\0';
  devType[0xd] = '\0';
  devType[0xe] = '\0';
  devType[0xf] = '\0';
  devType[0x10] = '\0';
  devType[0x11] = '\0';
  devType[0x12] = '\0';
  devType[0x13] = '\0';
  devType[0x14] = '\0';
  devType[0x15] = '\0';
  devType[0x16] = '\0';
  devType[0x17] = '\0';
  devType[0x18] = '\0';
  devType[0x19] = '\0';
  devType[0x1a] = '\0';
  devType[0x1b] = '\0';
  devType[0x1c] = '\0';
  devType[0x1d] = '\0';
  devType[0x1e] = '\0';
  devType[0x1f] = '\0';
  devType[0x20] = '\0';
  devType[0x21] = '\0';
  devType[0x22] = '\0';
  devType[0x23] = '\0';
  devType[0x24] = '\0';
  devType[0x25] = '\0';
  devType[0x26] = '\0';
  devType[0x27] = '\0';
  devType[0x28] = '\0';
  devType[0x29] = '\0';
  devType[0x2a] = '\0';
  devType[0x2b] = '\0';
  devType[0x2c] = '\0';
  devType[0x2d] = '\0';
  devType[0x2e] = '\0';
  devType[0x2f] = '\0';
  devType[0x30] = '\0';
  devType[0x31] = '\0';
  devType[0x32] = '\0';
  devType[0x33] = '\0';
  devType[0x34] = '\0';
  devType[0x35] = '\0';
  devType[0x36] = '\0';
  devType[0x37] = '\0';
  devType[0x38] = '\0';
  devType[0x39] = '\0';
  devType[0x3a] = '\0';
  devType[0x3b] = '\0';
  devType[0x3c] = '\0';
  devType[0x3d] = '\0';
  devType[0x3e] = '\0';
  devType[0x3f] = '\0';
  devType[0x40] = '\0';
  devType[0x41] = '\0';
  devType[0x42] = '\0';
  devType[0x43] = '\0';
  devType[0x44] = '\0';
  devType[0x45] = '\0';
  devType[0x46] = '\0';
  devType[0x47] = '\0';
  devType[0x48] = '\0';
  devType[0x49] = '\0';
  devType[0x4a] = '\0';
  devType[0x4b] = '\0';
  devType[0x4c] = '\0';
  devType[0x4d] = '\0';
  devType[0x4e] = '\0';
  devType[0x4f] = '\0';
  devType[0x50] = '\0';
  devType[0x51] = '\0';
  devType[0x52] = '\0';
  devType[0x53] = '\0';
  devType[0x54] = '\0';
  devType[0x55] = '\0';
  devType[0x56] = '\0';
  devType[0x57] = '\0';
  devType[0x58] = '\0';
  devType[0x59] = '\0';
  devType[0x5a] = '\0';
  devType[0x5b] = '\0';
  devType[0x5c] = '\0';
  devType[0x5d] = '\0';
  devType[0x5e] = '\0';
  devType[0x5f] = '\0';
  devType[0x60] = '\0';
  devType[0x61] = '\0';
  devType[0x62] = '\0';
  devType[99] = '\0';
  servType[0] = '\0';
  servType[1] = '\0';
  servType[2] = '\0';
  servType[3] = '\0';
  servType[4] = '\0';
  servType[5] = '\0';
  servType[6] = '\0';
  servType[7] = '\0';
  servType[8] = '\0';
  servType[9] = '\0';
  servType[10] = '\0';
  servType[0xb] = '\0';
  servType[0xc] = '\0';
  servType[0xd] = '\0';
  servType[0xe] = '\0';
  servType[0xf] = '\0';
  servType[0x10] = '\0';
  servType[0x11] = '\0';
  servType[0x12] = '\0';
  servType[0x13] = '\0';
  servType[0x14] = '\0';
  servType[0x15] = '\0';
  servType[0x16] = '\0';
  servType[0x17] = '\0';
  servType[0x18] = '\0';
  servType[0x19] = '\0';
  servType[0x1a] = '\0';
  servType[0x1b] = '\0';
  servType[0x1c] = '\0';
  servType[0x1d] = '\0';
  servType[0x1e] = '\0';
  servType[0x1f] = '\0';
  servType[0x20] = '\0';
  servType[0x21] = '\0';
  servType[0x22] = '\0';
  servType[0x23] = '\0';
  servType[0x24] = '\0';
  servType[0x25] = '\0';
  servType[0x26] = '\0';
  servType[0x27] = '\0';
  servType[0x28] = '\0';
  servType[0x29] = '\0';
  servType[0x2a] = '\0';
  servType[0x2b] = '\0';
  servType[0x2c] = '\0';
  servType[0x2d] = '\0';
  servType[0x2e] = '\0';
  servType[0x2f] = '\0';
  servType[0x30] = '\0';
  servType[0x31] = '\0';
  servType[0x32] = '\0';
  servType[0x33] = '\0';
  servType[0x34] = '\0';
  servType[0x35] = '\0';
  servType[0x36] = '\0';
  servType[0x37] = '\0';
  servType[0x38] = '\0';
  servType[0x39] = '\0';
  servType[0x3a] = '\0';
  servType[0x3b] = '\0';
  servType[0x3c] = '\0';
  servType[0x3d] = '\0';
  servType[0x3e] = '\0';
  servType[0x3f] = '\0';
  servType[0x40] = '\0';
  servType[0x41] = '\0';
  servType[0x42] = '\0';
  servType[0x43] = '\0';
  servType[0x44] = '\0';
  servType[0x45] = '\0';
  servType[0x46] = '\0';
  servType[0x47] = '\0';
  servType[0x48] = '\0';
  servType[0x49] = '\0';
  servType[0x4a] = '\0';
  servType[0x4b] = '\0';
  servType[0x4c] = '\0';
  servType[0x4d] = '\0';
  servType[0x4e] = '\0';
  servType[0x4f] = '\0';
  servType[0x50] = '\0';
  servType[0x51] = '\0';
  servType[0x52] = '\0';
  servType[0x53] = '\0';
  servType[0x54] = '\0';
  servType[0x55] = '\0';
  servType[0x56] = '\0';
  servType[0x57] = '\0';
  servType[0x58] = '\0';
  servType[0x59] = '\0';
  servType[0x5a] = '\0';
  servType[0x5b] = '\0';
  servType[0x5c] = '\0';
  servType[0x5d] = '\0';
  servType[0x5e] = '\0';
  servType[0x5f] = '\0';
  servType[0x60] = '\0';
  servType[0x61] = '\0';
  servType[0x62] = '\0';
  servType[99] = '\0';
  local_1d0 = DestAddr;
  local_1c8 = DeviceType;
  local_1c0 = SearchType;
  local_1bc = AdFlag;
  UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0x7b,
             "Inside AdvertiseAndReply with AdFlag = %d\n");
  UpnpPrintf(UPNP_NEVER,API,".upnp/src/ssdp/ssdp_server.c",0x80,"Trying a read lock\n");
  pthread_rwlock_rdlock((pthread_rwlock_t *)&GlobalHndRWLock);
  UpnpPrintf(UPNP_NEVER,API,".upnp/src/ssdp/ssdp_server.c",0x80,"Read lock acquired\n");
  UVar1 = GetHandleInfo(Hnd,&SInfo);
  if (UVar1 != HND_DEVICE) {
    iVar3 = -100;
    lVar6 = 0;
LAB_001289aa:
    ixmlNodeList_free(0);
    ixmlNodeList_free(lVar6);
    UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0x217,"Exiting AdvertiseAndReply.\n");
    UpnpPrintf(UPNP_NEVER,API,".upnp/src/ssdp/ssdp_server.c",0x219,"Trying Unlock\n");
    pthread_rwlock_unlock((pthread_rwlock_t *)&GlobalHndRWLock);
    UpnpPrintf(UPNP_NEVER,API,".upnp/src/ssdp/ssdp_server.c",0x219,"Unlocked rwlock\n");
    return iVar3;
  }
  Duration = SInfo->MaxAge;
  lVar6 = 0;
  iVar2 = 0;
  local_1b0 = DeviceUDN;
  do {
    if (iVar2 != 0) {
      iVar3 = 0;
      if ((local_1bc == 0) || (iVar2 != 1)) goto LAB_001289aa;
      req.tv_sec = 0;
      req.tv_nsec = 100000000;
      nanosleep((timespec *)&req,(timespec *)0x0);
    }
    lVar4 = 0;
    local_1a4 = iVar2;
    while( true ) {
      UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0x8f,
                 "Entering new device list with i = %lu\n\n",lVar4);
      local_1b8 = lVar4;
      lVar4 = ixmlNodeList_item(SInfo->DeviceList,lVar4);
      if (lVar4 == 0) break;
      uVar5 = ixmlNode_getNodeName(lVar4);
      UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0xa1,
                 "Extracting device type once for %s\n",uVar5);
      ixmlNodeList_free(lVar6);
      lVar6 = ixmlElement_getElementsByTagName(lVar4,"deviceType");
      if (lVar6 == 0) {
LAB_001286ac:
        lVar6 = 0;
      }
      else {
        UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0xac,"Extracting UDN for %s\n",uVar5)
        ;
        UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0xb2,"Extracting device type\n");
        lVar7 = ixmlNodeList_item(lVar6,0);
        if ((lVar7 != 0) && (lVar7 = ixmlNode_getFirstChild(lVar7), lVar7 != 0)) {
          UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0xbd,"Extracting device type \n");
          pcVar8 = (char *)ixmlNode_getNodeValue(lVar7);
          if (pcVar8 != (char *)0x0) {
            strncpy(devType,pcVar8,99);
            UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0xc6,
                       "Extracting device type = %s\n",devType);
            uVar5 = ixmlNode_getNodeName(lVar4);
            UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0xd4,"Extracting UDN for %s\n",
                       uVar5);
            ixmlNodeList_free(lVar6);
            lVar6 = ixmlElement_getElementsByTagName(lVar4,"UDN");
            if (lVar6 == 0) {
              UpnpPrintf(UPNP_CRITICAL,API,".upnp/src/ssdp/ssdp_server.c",0xde,"UDN not found!\n");
              lVar6 = 0;
            }
            else {
              lVar7 = ixmlNodeList_item(lVar6,0);
              if (lVar7 == 0) {
                UpnpPrintf(UPNP_CRITICAL,API,".upnp/src/ssdp/ssdp_server.c",0xe7,"UDN not found!\n")
                ;
              }
              else {
                lVar7 = ixmlNode_getFirstChild();
                if (lVar7 == 0) {
                  iVar2 = 0xf0;
                }
                else {
                  pcVar8 = (char *)ixmlNode_getNodeValue();
                  if (pcVar8 != (char *)0x0) {
                    strncpy(UDNstr,pcVar8,99);
                    UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x101,
                               "Sending UDNStr = %s \n",UDNstr);
                    pcVar8 = local_1b0;
                    if (local_1bc == 0) {
                      switch(local_1c0) {
                      case SSDP_ALL:
                        DeviceReply(local_1d0,devType,(uint)(local_1b8 == 0),UDNstr,SInfo->DescURL,
                                    Duration,SInfo->PowerState,SInfo->SleepPeriod,
                                    SInfo->RegistrationState);
                        break;
                      case SSDP_ROOTDEVICE:
                        if (local_1b8 == 0) {
                          SendReply(local_1d0,devType,1,UDNstr,SInfo->DescURL,Duration,0,
                                    SInfo->PowerState,SInfo->SleepPeriod,SInfo->RegistrationState);
                        }
                        break;
                      case SSDP_DEVICEUDN:
                        if ((local_1b0 != (char *)0x0) && (*local_1b0 != '\0')) {
                          iVar2 = strcasecmp(local_1b0,UDNstr);
                          if (iVar2 == 0) {
                            UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x13f,
                                       "DeviceUDN=%s and search UDN=%s MATCH\n",UDNstr,pcVar8);
                            pcVar10 = SInfo->DescURL;
                            iVar3 = SInfo->PowerState;
                            SleepPeriod = SInfo->SleepPeriod;
                            iVar2 = SInfo->RegistrationState;
                            pcVar8 = devType;
                            ByType = 0;
                            goto LAB_00128937;
                          }
                          iVar2 = 0x13b;
                          FmtStr = "DeviceUDN=%s and search UDN=%s DID NOT match\n";
                          pcVar10 = UDNstr;
LAB_00128967:
                          UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",iVar2,FmtStr,
                                     pcVar10,pcVar8);
                        }
                        break;
                      case SSDP_DEVICETYPE:
                        sVar9 = strlen(local_1c8);
                        iVar2 = strncasecmp(local_1c8,devType,sVar9 - 2);
                        if (iVar2 == 0) {
                          pcVar8 = strrchr(local_1c8,0x3a);
                          iVar2 = atoi(pcVar8 + 1);
                          sVar9 = strlen(devType);
                          iVar3 = atoi(devType + (sVar9 - 1));
                          pcVar8 = local_1c8;
                          if (iVar2 < iVar3) {
                            UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x153,
                                       "DeviceType=%s and search devType=%s MATCH\n",devType,
                                       local_1c8);
                            pcVar10 = SInfo->LowerDescURL;
                          }
                          else {
                            if (iVar2 != iVar3) {
                              iVar2 = 0x166;
                              FmtStr = "DeviceType=%s and search devType=%s DID NOT MATCH\n";
                              pcVar10 = devType;
                              goto LAB_00128967;
                            }
                            UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x15d,
                                       "DeviceType=%s and search devType=%s MATCH\n",devType,
                                       local_1c8);
                            pcVar10 = SInfo->DescURL;
                          }
                          iVar3 = SInfo->PowerState;
                          SleepPeriod = SInfo->SleepPeriod;
                          iVar2 = SInfo->RegistrationState;
                          ByType = 1;
LAB_00128937:
                          SendReply(local_1d0,pcVar8,0,UDNstr,pcVar10,Duration,ByType,iVar3,
                                    SleepPeriod,iVar2);
                        }
                        else {
                          UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x16b,
                                     "DeviceType=%s and search devType=%s DID NOT MATCH\n",devType,
                                     local_1c8);
                        }
                      }
                    }
                    else if (local_1bc == 1) {
                      DeviceAdvertisement(devType,(uint)(local_1b8 == 0),UDNstr,SInfo->DescURL,Exp,
                                          SInfo->DeviceAf,SInfo->PowerState,SInfo->SleepPeriod,
                                          SInfo->RegistrationState);
                    }
                    else {
                      DeviceShutdown(devType,(uint)(local_1b8 == 0),UDNstr,SInfo->DescURL,Exp,
                                     SInfo->DeviceAf,SInfo->PowerState,SInfo->SleepPeriod,
                                     SInfo->RegistrationState);
                    }
                    UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x17b,
                               "Sending service Advertisement\n");
                    for (lVar4 = ixmlNode_getFirstChild(lVar4); lVar4 != 0;
                        lVar4 = ixmlNode_getNextSibling(lVar4)) {
                      pcVar8 = (char *)ixmlNode_getNodeName(lVar4);
                      iVar2 = strncmp(pcVar8,"serviceList",0xc);
                      if (iVar2 == 0) {
                        ixmlNodeList_free(lVar6);
                        local_1a0 = ixmlElement_getElementsByTagName(lVar4,"service");
                        if (local_1a0 == 0) {
                          UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x196,
                                     "Service not found 3\n");
                          goto LAB_001286ac;
                        }
                        lVar4 = 0;
                        lVar6 = 0;
                        goto LAB_001283a1;
                      }
                    }
LAB_001286a7:
                    ixmlNodeList_free(lVar6);
                    goto LAB_001286ac;
                  }
                  iVar2 = 0xf9;
                }
                UpnpPrintf(UPNP_CRITICAL,API,".upnp/src/ssdp/ssdp_server.c",iVar2,"UDN not found!\n"
                          );
              }
            }
          }
        }
      }
      lVar4 = local_1b8 + 1;
    }
    iVar2 = local_1a4 + 1;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0x97,
               "Exiting new device list with i = %lu\n\n",local_1b8);
  } while( true );
LAB_001283a1:
  lVar7 = ixmlNodeList_item(local_1a0,lVar4);
  ixmlNodeList_free(lVar6);
  lVar6 = local_1a0;
  if (lVar7 == 0) goto LAB_001286a7;
  lVar6 = ixmlElement_getElementsByTagName(lVar7,"serviceType");
  if (lVar6 == 0) {
    UpnpPrintf(UPNP_CRITICAL,API,".upnp/src/ssdp/ssdp_server.c",0x1a6,"ServiceType not found \n");
  }
  else {
    lVar7 = ixmlNodeList_item(lVar6,0);
    if (((lVar7 != 0) && (lVar7 = ixmlNode_getFirstChild(lVar7), lVar7 != 0)) &&
       (pcVar8 = (char *)ixmlNode_getNodeValue(lVar7), pcVar8 != (char *)0x0)) {
      strncpy(servType,pcVar8,99);
      UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x1b9,"ServiceType = %s\n",servType);
      if (local_1bc == 0) {
        if (local_1c0 == SSDP_SERVICE) {
          if (ServiceType != (char *)0x0) {
            sVar9 = strlen(ServiceType);
            iVar2 = strncasecmp(ServiceType,servType,sVar9 - 2);
            if (iVar2 == 0) {
              pcVar8 = strrchr(ServiceType,0x3a);
              local_1a8 = atoi(pcVar8 + 1);
              sVar9 = strlen(servType);
              iVar2 = atoi(servType + (sVar9 - 1));
              if (local_1a8 < iVar2) {
                UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x1e6,
                           "ServiceType=%s and search servType=%s MATCH\n",ServiceType,servType);
                pcVar8 = SInfo->LowerDescURL;
              }
              else {
                if (local_1a8 != iVar2) {
                  iVar2 = 0x1f9;
                  goto LAB_0012856f;
                }
                UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x1f0,
                           "ServiceType=%s and search servType=%s MATCH\n",ServiceType,servType);
                pcVar8 = SInfo->DescURL;
              }
              SendReply(local_1d0,ServiceType,0,UDNstr,pcVar8,Duration,1,SInfo->PowerState,
                        SInfo->SleepPeriod,SInfo->RegistrationState);
            }
            else {
              iVar2 = 0x1fe;
LAB_0012856f:
              UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",iVar2,
                         "ServiceType=%s and search servType=%s DID NOT MATCH\n",ServiceType,
                         servType);
            }
          }
        }
        else if (local_1c0 == SSDP_ALL) {
          ServiceReply(local_1d0,servType,UDNstr,SInfo->DescURL,Duration,SInfo->PowerState,
                       SInfo->SleepPeriod,SInfo->RegistrationState);
        }
      }
      else if (local_1bc == 1) {
        ServiceAdvertisement
                  (UDNstr,servType,SInfo->DescURL,Exp,SInfo->DeviceAf,SInfo->PowerState,
                   SInfo->SleepPeriod,SInfo->RegistrationState);
      }
      else {
        ServiceShutdown(UDNstr,servType,SInfo->DescURL,Exp,SInfo->DeviceAf,SInfo->PowerState,
                        SInfo->SleepPeriod,SInfo->RegistrationState);
      }
    }
  }
  lVar4 = lVar4 + 1;
  goto LAB_001283a1;
}

Assistant:

int AdvertiseAndReply(int AdFlag,
	UpnpDevice_Handle Hnd,
	enum SsdpSearchType SearchType,
	struct sockaddr *DestAddr,
	char *DeviceType,
	char *DeviceUDN,
	char *ServiceType,
	int Exp)
{
	int retVal = UPNP_E_SUCCESS;
	long unsigned int i;
	long unsigned int j;
	int defaultExp = DEFAULT_MAXAGE;
	struct Handle_Info *SInfo = NULL;
	char UDNstr[100];
	char devType[100];
	char servType[100];
	IXML_NodeList *nodeList = NULL;
	IXML_NodeList *tmpNodeList = NULL;
	IXML_Node *tmpNode = NULL;
	IXML_Node *tmpNode2 = NULL;
	IXML_Node *textNode = NULL;
	const DOMString tmpStr;
	const DOMString dbgStr;
	int NumCopy = 0;

	memset(UDNstr, 0, sizeof(UDNstr));
	memset(devType, 0, sizeof(devType));
	memset(servType, 0, sizeof(servType));

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside AdvertiseAndReply with AdFlag = %d\n",
		AdFlag);

	/* Use a read lock */
	HandleReadLock(__FILE__, __LINE__);
	if (GetHandleInfo(Hnd, &SInfo) != HND_DEVICE) {
		retVal = UPNP_E_INVALID_HANDLE;
		goto end_function;
	}
	defaultExp = SInfo->MaxAge;
	/* parse the device list and send advertisements/replies */
	while (NumCopy == 0 || (AdFlag && NumCopy < NUM_SSDP_COPY)) {
		if (NumCopy != 0)
			imillisleep(SSDP_PAUSE);
		NumCopy++;
		for (i = 0lu;; i++) {
			UpnpPrintf(UPNP_ALL,
				API,
				__FILE__,
				__LINE__,
				"Entering new device list with i = %lu\n\n",
				i);
			tmpNode = ixmlNodeList_item(SInfo->DeviceList, i);
			if (!tmpNode) {
				UpnpPrintf(UPNP_ALL,
					API,
					__FILE__,
					__LINE__,
					"Exiting new device list with i = "
					"%lu\n\n",
					i);
				break;
			}
			dbgStr = ixmlNode_getNodeName(tmpNode);
			UpnpPrintf(UPNP_INFO,
				API,
				__FILE__,
				__LINE__,
				"Extracting device type once for %s\n",
				dbgStr);
			ixmlNodeList_free(nodeList);
			nodeList = ixmlElement_getElementsByTagName(
				(IXML_Element *)tmpNode, "deviceType");
			if (!nodeList)
				continue;
			UpnpPrintf(UPNP_ALL,
				API,
				__FILE__,
				__LINE__,
				"Extracting UDN for %s\n",
				dbgStr);
			UpnpPrintf(UPNP_ALL,
				API,
				__FILE__,
				__LINE__,
				"Extracting device type\n");
			tmpNode2 = ixmlNodeList_item(nodeList, 0lu);
			if (!tmpNode2)
				continue;
			textNode = ixmlNode_getFirstChild(tmpNode2);
			if (!textNode)
				continue;
			UpnpPrintf(UPNP_ALL,
				API,
				__FILE__,
				__LINE__,
				"Extracting device type \n");
			tmpStr = ixmlNode_getNodeValue(textNode);
			if (!tmpStr)
				continue;
			strncpy(devType, tmpStr, sizeof(devType) - 1);
			UpnpPrintf(UPNP_ALL,
				API,
				__FILE__,
				__LINE__,
				"Extracting device type = %s\n",
				devType);
			if (!tmpNode) {
				UpnpPrintf(UPNP_ALL,
					API,
					__FILE__,
					__LINE__,
					"TempNode is NULL\n");
			}
			dbgStr = ixmlNode_getNodeName(tmpNode);
			UpnpPrintf(UPNP_ALL,
				API,
				__FILE__,
				__LINE__,
				"Extracting UDN for %s\n",
				dbgStr);
			ixmlNodeList_free(nodeList);
			nodeList = ixmlElement_getElementsByTagName(
				(IXML_Element *)tmpNode, "UDN");
			if (!nodeList) {
				UpnpPrintf(UPNP_CRITICAL,
					API,
					__FILE__,
					__LINE__,
					"UDN not found!\n");
				continue;
			}
			tmpNode2 = ixmlNodeList_item(nodeList, 0lu);
			if (!tmpNode2) {
				UpnpPrintf(UPNP_CRITICAL,
					API,
					__FILE__,
					__LINE__,
					"UDN not found!\n");
				continue;
			}
			textNode = ixmlNode_getFirstChild(tmpNode2);
			if (!textNode) {
				UpnpPrintf(UPNP_CRITICAL,
					API,
					__FILE__,
					__LINE__,
					"UDN not found!\n");
				continue;
			}
			tmpStr = ixmlNode_getNodeValue(textNode);
			if (!tmpStr) {
				UpnpPrintf(UPNP_CRITICAL,
					API,
					__FILE__,
					__LINE__,
					"UDN not found!\n");
				continue;
			}
			strncpy(UDNstr, tmpStr, sizeof(UDNstr) - 1);
			UpnpPrintf(UPNP_INFO,
				API,
				__FILE__,
				__LINE__,
				"Sending UDNStr = %s \n",
				UDNstr);
			if (AdFlag) {
				/* send the device advertisement */
				if (AdFlag == 1) {
					DeviceAdvertisement(devType,
						i == 0lu,
						UDNstr,
						SInfo->DescURL,
						Exp,
						SInfo->DeviceAf,
						SInfo->PowerState,
						SInfo->SleepPeriod,
						SInfo->RegistrationState);
				} else {
					/* AdFlag == -1 */
					DeviceShutdown(devType,
						i == 0lu,
						UDNstr,
						SInfo->DescURL,
						Exp,
						SInfo->DeviceAf,
						SInfo->PowerState,
						SInfo->SleepPeriod,
						SInfo->RegistrationState);
				}
			} else {
				switch (SearchType) {
				case SSDP_ALL:
					DeviceReply(DestAddr,
						devType,
						i == 0lu,
						UDNstr,
						SInfo->DescURL,
						defaultExp,
						SInfo->PowerState,
						SInfo->SleepPeriod,
						SInfo->RegistrationState);
					break;
				case SSDP_ROOTDEVICE:
					if (i == 0lu) {
						SendReply(DestAddr,
							devType,
							1,
							UDNstr,
							SInfo->DescURL,
							defaultExp,
							0,
							SInfo->PowerState,
							SInfo->SleepPeriod,
							SInfo->RegistrationState);
					}
					break;
				case SSDP_DEVICEUDN: {
					/* clang-format off */
					if (DeviceUDN && strlen(DeviceUDN) != (size_t)0) {
						if (strcasecmp(DeviceUDN, UDNstr)) {
							UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
								"DeviceUDN=%s and search UDN=%s DID NOT match\n",
								UDNstr, DeviceUDN);
						} else {
							UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
								"DeviceUDN=%s and search UDN=%s MATCH\n",
								UDNstr, DeviceUDN);
							SendReply(DestAddr, devType, 0, UDNstr, SInfo->DescURL, defaultExp, 0,
								SInfo->PowerState,
								SInfo->SleepPeriod,
								SInfo->RegistrationState);
						}
					}
					/* clang-format on */
					break;
				}
				case SSDP_DEVICETYPE: {
					/* clang-format off */
					if (!strncasecmp(DeviceType, devType, strlen(DeviceType) - (size_t)2)) {
						if (atoi(strrchr(DeviceType, ':') + 1)
						    < atoi(&devType[strlen(devType) - (size_t)1])) {
							/* the requested version is lower than the device version
							 * must reply with the lower version number and the lower
							 * description URL */
							UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
								   "DeviceType=%s and search devType=%s MATCH\n",
								   devType, DeviceType);
							SendReply(DestAddr, DeviceType, 0, UDNstr, SInfo->LowerDescURL,
								  defaultExp, 1,
								  SInfo->PowerState,
								  SInfo->SleepPeriod,
								  SInfo->RegistrationState);
						} else if (atoi(strrchr(DeviceType, ':') + 1)
							   == atoi(&devType[strlen(devType) - (size_t)1])) {
							UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
								   "DeviceType=%s and search devType=%s MATCH\n",
								   devType, DeviceType);
							SendReply(DestAddr, DeviceType, 0, UDNstr, SInfo->DescURL,
								  defaultExp, 1,
								  SInfo->PowerState,
								  SInfo->SleepPeriod,
								  SInfo->RegistrationState);
						} else {
							UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
								   "DeviceType=%s and search devType=%s DID NOT MATCH\n",
								   devType, DeviceType);
						}
					} else {
						UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
							   "DeviceType=%s and search devType=%s DID NOT MATCH\n",
							   devType, DeviceType);
					}
					/* clang-format on */
					break;
				}
				default:
					break;
				}
			}
			/* send service advertisements for services
			 * corresponding to the same device */
			UpnpPrintf(UPNP_INFO,
				API,
				__FILE__,
				__LINE__,
				"Sending service Advertisement\n");
			/* Correct service traversal such that each device's
			 * serviceList is directly traversed as a child of its
			 * parent device. This ensures that the service's alive
			 * message uses the UDN of the parent device. */
			tmpNode = ixmlNode_getFirstChild(tmpNode);
			while (tmpNode) {
				dbgStr = ixmlNode_getNodeName(tmpNode);
				if (!strncmp(dbgStr,
					    SERVICELIST_STR,
					    sizeof SERVICELIST_STR)) {
					break;
				}
				tmpNode = ixmlNode_getNextSibling(tmpNode);
			}
			ixmlNodeList_free(nodeList);
			if (!tmpNode) {
				nodeList = NULL;
				continue;
			}
			nodeList = ixmlElement_getElementsByTagName(
				(IXML_Element *)tmpNode, "service");
			if (!nodeList) {
				UpnpPrintf(UPNP_INFO,
					API,
					__FILE__,
					__LINE__,
					"Service not found 3\n");
				continue;
			}
			for (j = 0lu;; j++) {
				tmpNode = ixmlNodeList_item(nodeList, j);
				if (!tmpNode) {
					break;
				}
				ixmlNodeList_free(tmpNodeList);
				tmpNodeList = ixmlElement_getElementsByTagName(
					(IXML_Element *)tmpNode, "serviceType");
				if (!tmpNodeList) {
					UpnpPrintf(UPNP_CRITICAL,
						API,
						__FILE__,
						__LINE__,
						"ServiceType not found \n");
					continue;
				}
				tmpNode2 = ixmlNodeList_item(tmpNodeList, 0lu);
				if (!tmpNode2)
					continue;
				textNode = ixmlNode_getFirstChild(tmpNode2);
				if (!textNode)
					continue;
				/* servType is of format
				 * Servicetype:ServiceVersion */
				tmpStr = ixmlNode_getNodeValue(textNode);
				if (!tmpStr)
					continue;
				strncpy(servType, tmpStr, sizeof(servType) - 1);
				UpnpPrintf(UPNP_INFO,
					API,
					__FILE__,
					__LINE__,
					"ServiceType = %s\n",
					servType);
				if (AdFlag) {
					if (AdFlag == 1) {
						ServiceAdvertisement(UDNstr,
							servType,
							SInfo->DescURL,
							Exp,
							SInfo->DeviceAf,
							SInfo->PowerState,
							SInfo->SleepPeriod,
							SInfo->RegistrationState);
					} else {
						/* AdFlag == -1 */
						ServiceShutdown(UDNstr,
							servType,
							SInfo->DescURL,
							Exp,
							SInfo->DeviceAf,
							SInfo->PowerState,
							SInfo->SleepPeriod,
							SInfo->RegistrationState);
					}
				} else {
					switch (SearchType) {
					case SSDP_ALL:
						ServiceReply(DestAddr,
							servType,
							UDNstr,
							SInfo->DescURL,
							defaultExp,
							SInfo->PowerState,
							SInfo->SleepPeriod,
							SInfo->RegistrationState);
						break;
					case SSDP_SERVICE:
						/* clang-format off */
						if (ServiceType) {
							if (!strncasecmp(ServiceType, servType, strlen(ServiceType) - (size_t)2)) {
								if (atoi(strrchr(ServiceType, ':') + 1) <
								    atoi(&servType[strlen(servType) - (size_t)1])) {
									/* the requested version is lower than the service version
									 * must reply with the lower version number and the lower
									 * description URL */
									UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
										   "ServiceType=%s and search servType=%s MATCH\n",
										   ServiceType, servType);
									SendReply(DestAddr, ServiceType, 0, UDNstr, SInfo->LowerDescURL,
										  defaultExp, 1,
										  SInfo->PowerState,
										  SInfo->SleepPeriod,
										  SInfo->RegistrationState);
								} else if (atoi(strrchr (ServiceType, ':') + 1) ==
									   atoi(&servType[strlen(servType) - (size_t)1])) {
									UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
										   "ServiceType=%s and search servType=%s MATCH\n",
										   ServiceType, servType);
									SendReply(DestAddr, ServiceType, 0, UDNstr, SInfo->DescURL,
										  defaultExp, 1,
										  SInfo->PowerState,
										  SInfo->SleepPeriod,
										  SInfo->RegistrationState);
								} else {
									UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
									   "ServiceType=%s and search servType=%s DID NOT MATCH\n",
									   ServiceType, servType);
								}
							} else {
								UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
									   "ServiceType=%s and search servType=%s DID NOT MATCH\n",
									   ServiceType, servType);
							}
						}
						/* clang-format on */
						break;
					default:
						break;
					}
				}
			}
			ixmlNodeList_free(tmpNodeList);
			tmpNodeList = NULL;
			ixmlNodeList_free(nodeList);
			nodeList = NULL;
		}
	}

end_function:
	ixmlNodeList_free(tmpNodeList);
	ixmlNodeList_free(nodeList);
	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting AdvertiseAndReply.\n");
	HandleUnlock(__FILE__, __LINE__);

	return retVal;
}